

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitGlobalGet(BinaryInstWriter *this,GlobalGet *curr)

{
  uint32_t uVar1;
  iterator iVar2;
  BufferWithRandomAccess *pBVar3;
  size_t sVar4;
  Index i;
  uint uVar5;
  GlobalGet *local_38;
  
  uVar1 = WasmBinaryWriter::getGlobalIndex(this->parent,(Name)(curr->name).super_IString.str);
  local_38 = curr;
  iVar2 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->extractedGets)._M_h,(key_type *)&local_38);
  if (iVar2.super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>.
      _M_cur == (__node_type *)0x0) {
    sVar4 = wasm::Type::size(&(curr->super_SpecificExpression<(wasm::Expression::Id)10>).
                              super_Expression.type);
    for (uVar5 = 0; uVar5 < sVar4; uVar5 = uVar5 + 1) {
      pBVar3 = BufferWithRandomAccess::operator<<(this->o,'#');
      BufferWithRandomAccess::operator<<(pBVar3,(U32LEB)(uVar1 + uVar5));
    }
  }
  else {
    pBVar3 = BufferWithRandomAccess::operator<<(this->o,'#');
    BufferWithRandomAccess::operator<<
              (pBVar3,(U32LEB)(uVar1 + *(int *)((long)iVar2.
                                                  super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>
                                                  ._M_cur + 0x10)));
  }
  return;
}

Assistant:

void BinaryInstWriter::visitGlobalGet(GlobalGet* curr) {
  Index index = parent.getGlobalIndex(curr->name);
  if (auto it = extractedGets.find(curr); it != extractedGets.end()) {
    // We have a tuple of globals to get, but we will only end up using one of
    // them, so we can just emit that one.
    o << int8_t(BinaryConsts::GlobalGet) << U32LEB(index + it->second);
    return;
  }
  // Emit a global.get for each element if this is a tuple global
  size_t numValues = curr->type.size();
  for (Index i = 0; i < numValues; ++i) {
    o << int8_t(BinaryConsts::GlobalGet) << U32LEB(index + i);
  }
}